

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int star_oh(char *z)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = isConsonant(z);
  uVar2 = 0;
  if ((iVar1 != 0) && (2 < (byte)(*z + 0x89U))) {
    iVar1 = isVowel(z + 1);
    if (iVar1 != 0) {
      iVar1 = isConsonant(z + 2);
      uVar2 = (uint)(iVar1 != 0);
    }
  }
  return uVar2;
}

Assistant:

static int star_oh(const char *z){
  return
    isConsonant(z) &&
    z[0]!='w' && z[0]!='x' && z[0]!='y' &&
    isVowel(z+1) &&
    isConsonant(z+2);
}